

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButtonPrivate::onMenuTriggered(QToolButtonPrivate *this,QAction *action)

{
  QToolButton *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QAction *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = action;
  if (action != (QAction *)0x0) {
    this_00 = *(QToolButton **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
    bVar1 = QListSpecialMethodsBase<QAction*>::contains<QAction*>
                      ((QListSpecialMethodsBase<QAction*> *)&this->actionsCopy,&local_18);
    if (!bVar1) {
      QToolButton::triggered(this_00,local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButtonPrivate::onMenuTriggered(QAction *action)
{
    Q_Q(QToolButton);
    if (action && !actionsCopy.contains(action))
        emit q->triggered(action);
}